

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

longlong __thiscall mkvparser::Segment::ParseHeaders(Segment *this)

{
  int iVar1;
  longlong lVar2;
  longlong lVar3;
  Tags *this_00;
  SegmentInfo *this_01;
  Chapters *this_02;
  Cues *this_03;
  SeekHead *this_04;
  Tracks *this_05;
  ulong pos;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long len;
  longlong available;
  longlong total;
  long local_48;
  long local_40;
  ulong local_38;
  
  iVar1 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&local_38,&local_40);
  if (iVar1 < 0) {
    lVar7 = (long)iVar1;
  }
  else {
    lVar7 = -2;
    if (((long)local_38 < 1) || (local_40 <= (long)local_38)) {
      uVar4 = 0xffffffffffffffff;
      if (-1 < this->m_size) {
        uVar4 = this->m_start + this->m_size;
      }
      if (((long)uVar4 <= (long)local_38 || (long)(uVar4 | local_38) < 0) &&
         (uVar8 = this->m_pos, (long)uVar4 < 0 || (long)uVar8 <= (long)uVar4)) {
        if (((long)local_38 < 0 || (long)uVar8 < (long)local_38) &&
           (pos = uVar8, (long)uVar4 < 0 || (long)uVar8 < (long)uVar4)) {
          while( true ) {
            lVar5 = pos + 1;
            if (lVar5 < 0) {
              return -2;
            }
            if (local_40 < lVar5) {
              return lVar5;
            }
            lVar2 = GetUIntLength(this->m_pReader,pos,&local_48);
            if (lVar2 < 0) {
              return lVar2;
            }
            if (lVar2 != 0) {
              return lVar5;
            }
            lVar5 = local_48 + pos;
            if ((-1 < (long)uVar4) && ((long)uVar4 < lVar5)) {
              return -2;
            }
            if (local_40 < lVar5) {
              return lVar5;
            }
            lVar2 = ReadID(this->m_pReader,pos,&local_48);
            if (lVar2 < 0) {
              return -2;
            }
            if (lVar2 == 0x1f43b675) break;
            lVar5 = local_48 + pos;
            if (local_40 <= lVar5) {
LAB_00159f4a:
              return lVar5 + 1;
            }
            lVar3 = GetUIntLength(this->m_pReader,lVar5,&local_48);
            if (lVar3 < 0) {
              return lVar3;
            }
            if (lVar3 != 0) goto LAB_00159f4a;
            lVar6 = local_48 + lVar5;
            if ((-1 < (long)uVar4) && ((long)uVar4 < lVar6)) {
              return -2;
            }
            if (local_40 < lVar6) {
              return lVar6;
            }
            lVar3 = ReadUInt(this->m_pReader,lVar5,&local_48);
            if (lVar3 < 0) {
              return lVar3;
            }
            if (local_48 - 9U < 0xfffffffffffffff8) {
              return lVar3;
            }
            lVar5 = local_48 + lVar5;
            uVar8 = lVar3 + lVar5;
            if ((long)uVar8 < 0) {
              return -2;
            }
            if (uVar4 < uVar8) {
              return -2;
            }
            if (local_40 < (long)uVar8) {
              return uVar8;
            }
            lVar6 = uVar8 - pos;
            if (lVar2 < 0x1549a966) {
              if (lVar2 == 0x1043a770) {
                if (this->m_pChapters == (Chapters *)0x0) {
                  this_02 = (Chapters *)operator_new(0x38,(nothrow_t *)&std::nothrow);
                  if (this_02 == (Chapters *)0x0) {
                    this->m_pChapters = (Chapters *)0x0;
                    return -1;
                  }
                  Chapters::Chapters(this_02,this,lVar5,lVar3,pos,lVar6);
                  this->m_pChapters = this_02;
                  lVar5 = Chapters::Parse(this_02);
                  goto LAB_00159ed5;
                }
              }
              else if (lVar2 == 0x114d9b74) {
                if (this->m_pSeekHead == (SeekHead *)0x0) {
                  this_04 = (SeekHead *)operator_new(0x48,(nothrow_t *)&std::nothrow);
                  if (this_04 == (SeekHead *)0x0) {
                    this->m_pSeekHead = (SeekHead *)0x0;
                    return -1;
                  }
                  SeekHead::SeekHead(this_04,this,lVar5,lVar3,pos,lVar6);
                  this->m_pSeekHead = this_04;
                  lVar5 = SeekHead::Parse(this_04);
                  goto LAB_00159ed5;
                }
              }
              else if ((lVar2 == 0x1254c367) && (this->m_pTags == (Tags *)0x0)) {
                this_00 = (Tags *)operator_new(0x38,(nothrow_t *)&std::nothrow);
                if (this_00 == (Tags *)0x0) {
                  this->m_pTags = (Tags *)0x0;
                  return -1;
                }
                Tags::Tags(this_00,this,lVar5,lVar3,pos,lVar6);
                this->m_pTags = this_00;
                lVar5 = Tags::Parse(this_00);
                goto LAB_00159ed5;
              }
            }
            else if (lVar2 == 0x1c53bb6b) {
              if (this->m_pCues == (Cues *)0x0) {
                this_03 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
                if (this_03 == (Cues *)0x0) {
                  this->m_pCues = (Cues *)0x0;
                  return -1;
                }
                Cues::Cues(this_03,this,lVar5,lVar3,pos,lVar6);
                this->m_pCues = this_03;
              }
            }
            else {
              if (lVar2 == 0x1654ae6b) {
                if (this->m_pTracks != (Tracks *)0x0) {
                  return -2;
                }
                this_05 = (Tracks *)operator_new(0x38,(nothrow_t *)&std::nothrow);
                if (this_05 == (Tracks *)0x0) {
                  this->m_pTracks = (Tracks *)0x0;
                  return -1;
                }
                Tracks::Tracks(this_05,this,lVar5,lVar3,pos,lVar6);
                this->m_pTracks = this_05;
                lVar5 = Tracks::Parse(this_05);
              }
              else {
                if (lVar2 != 0x1549a966) goto LAB_00159eda;
                if (this->m_pInfo != (SegmentInfo *)0x0) {
                  return -2;
                }
                this_01 = (SegmentInfo *)operator_new(0x50,(nothrow_t *)&std::nothrow);
                if (this_01 == (SegmentInfo *)0x0) {
                  this->m_pInfo = (SegmentInfo *)0x0;
                  return -1;
                }
                SegmentInfo::SegmentInfo(this_01,this,lVar5,lVar3,pos,lVar6);
                this->m_pInfo = this_01;
                lVar5 = SegmentInfo::Parse(this_01);
              }
LAB_00159ed5:
              if (lVar5 != 0) {
                return lVar5;
              }
            }
LAB_00159eda:
            this->m_pos = uVar8;
            if ((local_38 <= uVar8) || (pos = uVar8, uVar4 <= uVar8)) goto LAB_00159f0b;
          }
          uVar8 = this->m_pos;
        }
LAB_00159f0b:
        if (((long)uVar4 < 0 || (long)uVar8 <= (long)uVar4) && (this->m_pInfo != (SegmentInfo *)0x0)
           ) {
          lVar7 = (ulong)(this->m_pTracks != (Tracks *)0x0) * 2 + -2;
        }
      }
    }
  }
  return lVar7;
}

Assistant:

long long Segment::ParseHeaders() {
  // Outermost (level 0) segment object has been constructed,
  // and pos designates start of payload.  We need to find the
  // inner (level 1) elements.
  long long total, available;

  const int status = m_pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (total > 0 && available > total)
    return E_FILE_FORMAT_INVALID;

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  if ((segment_stop >= 0 && total >= 0 && segment_stop > total) ||
      (segment_stop >= 0 && m_pos > segment_stop)) {
    return E_FILE_FORMAT_INVALID;
  }

  for (;;) {
    if ((total >= 0) && (m_pos >= total))
      break;

    if ((segment_stop >= 0) && (m_pos >= segment_stop))
      break;

    long long pos = m_pos;
    const long long element_start = pos;

    // Avoid rolling over pos when very close to LLONG_MAX.
    unsigned long long rollover_check = pos + 1ULL;
    if (rollover_check > LLONG_MAX)
      return E_FILE_FORMAT_INVALID;

    if ((pos + 1) > available)
      return (pos + 1);

    long len;
    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return result;

    if (result > 0) {
      // MkvReader doesn't have enough data to satisfy this read attempt.
      return (pos + 1);
    }

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(m_pReader, idpos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvCluster)
      break;

    pos += len;  // consume ID

    if ((pos + 1) > available)
      return (pos + 1);

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return result;

    if (result > 0) {
      // MkvReader doesn't have enough data to satisfy this read attempt.
      return (pos + 1);
    }

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0 || len < 1 || len > 8) {
      // TODO(tomfinegan): ReadUInt should return an error when len is < 1 or
      // len > 8 is true instead of checking this _everywhere_.
      return size;
    }

    pos += len;  // consume length of size of element

    // Avoid rolling over pos when very close to LLONG_MAX.
    rollover_check = static_cast<unsigned long long>(pos) + size;
    if (rollover_check > LLONG_MAX)
      return E_FILE_FORMAT_INVALID;

    const long long element_size = size + pos - element_start;

    // Pos now points to start of payload

    if ((segment_stop >= 0) && ((pos + size) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    // We read EBML elements either in total or nothing at all.

    if ((pos + size) > available)
      return pos + size;

    if (id == libwebm::kMkvInfo) {
      if (m_pInfo)
        return E_FILE_FORMAT_INVALID;

      m_pInfo = new (std::nothrow)
          SegmentInfo(this, pos, size, element_start, element_size);

      if (m_pInfo == NULL)
        return -1;

      const long status = m_pInfo->Parse();

      if (status)
        return status;
    } else if (id == libwebm::kMkvTracks) {
      if (m_pTracks)
        return E_FILE_FORMAT_INVALID;

      m_pTracks = new (std::nothrow)
          Tracks(this, pos, size, element_start, element_size);

      if (m_pTracks == NULL)
        return -1;

      const long status = m_pTracks->Parse();

      if (status)
        return status;
    } else if (id == libwebm::kMkvCues) {
      if (m_pCues == NULL) {
        m_pCues = new (std::nothrow)
            Cues(this, pos, size, element_start, element_size);

        if (m_pCues == NULL)
          return -1;
      }
    } else if (id == libwebm::kMkvSeekHead) {
      if (m_pSeekHead == NULL) {
        m_pSeekHead = new (std::nothrow)
            SeekHead(this, pos, size, element_start, element_size);

        if (m_pSeekHead == NULL)
          return -1;

        const long status = m_pSeekHead->Parse();

        if (status)
          return status;
      }
    } else if (id == libwebm::kMkvChapters) {
      if (m_pChapters == NULL) {
        m_pChapters = new (std::nothrow)
            Chapters(this, pos, size, element_start, element_size);

        if (m_pChapters == NULL)
          return -1;

        const long status = m_pChapters->Parse();

        if (status)
          return status;
      }
    } else if (id == libwebm::kMkvTags) {
      if (m_pTags == NULL) {
        m_pTags = new (std::nothrow)
            Tags(this, pos, size, element_start, element_size);

        if (m_pTags == NULL)
          return -1;

        const long status = m_pTags->Parse();

        if (status)
          return status;
      }
    }

    m_pos = pos + size;  // consume payload
  }

  if (segment_stop >= 0 && m_pos > segment_stop)
    return E_FILE_FORMAT_INVALID;

  if (m_pInfo == NULL)  // TODO: liberalize this behavior
    return E_FILE_FORMAT_INVALID;

  if (m_pTracks == NULL)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}